

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::PrivateToLocalPass::Process(PrivateToLocalPass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  const_iterator __cbeg;
  Function *pFVar5;
  size_type sVar6;
  Operand *__x;
  pointer pOVar7;
  char cVar8;
  ulong uVar9;
  Status SVar10;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *ppVar11;
  uint uVar12;
  uint uVar13;
  Instruction *pIVar14;
  Instruction *inst;
  Instruction *pIVar15;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
  variables_to_move;
  iterator __end2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  localized_variables;
  uint32_t local_bc;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_b8;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *local_98;
  iterator iStack_90;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *local_88;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *local_80;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *local_78;
  Instruction *local_70;
  undefined1 local_68 [40];
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
  }
  bVar3 = EnumSet<spv::Capability>::contains
                    (&((this_00->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)
                      ->capabilities_,Addresses);
  SVar10 = SuccessWithoutChange;
  if (!bVar3) {
    local_98 = (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)0x0;
    iStack_90._M_current = (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)0x0;
    local_88 = (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)0x0;
    local_68._0_8_ = &p_Stack_38;
    local_68._8_8_ = (Instruction *)0x1;
    local_68._16_8_ = (Instruction *)0x0;
    local_68._24_8_ = 0;
    local_68._32_4_ = 1.0;
    local_40 = 0;
    p_Stack_38 = (__node_base_ptr)0x0;
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar15 = *(Instruction **)
               ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    pIVar14 = (Instruction *)
              ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    if (pIVar15 != pIVar14) {
      do {
        if (pIVar15->opcode_ == OpVariable) {
          uVar4 = (pIVar15->has_result_id_ & 1) + 1;
          if (pIVar15->has_type_id_ == false) {
            uVar4 = (uint)pIVar15->has_result_id_;
          }
          uVar4 = Instruction::GetSingleWordOperand(pIVar15,uVar4);
          if (uVar4 == 6) {
            pFVar5 = FindLocalFunction(this,pIVar15);
            if (pFVar5 != (Function *)0x0) {
              local_b8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar15;
              local_b8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)pFVar5;
              if (iStack_90._M_current == local_88) {
                std::
                vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>>
                ::_M_realloc_insert<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>
                          ((vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>>
                            *)&local_98,iStack_90,
                           (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)
                           &local_b8);
              }
              else {
                local_b8.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pIVar15,0);
                local_b8.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start._4_4_ =
                     (undefined4)((ulong)pIVar15 >> 0x20);
                local_b8.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pFVar5,0);
                local_b8.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_finish._4_4_ =
                     (undefined4)((ulong)pFVar5 >> 0x20);
                *(undefined4 *)&(iStack_90._M_current)->first =
                     local_b8.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_;
                *(undefined4 *)((long)&(iStack_90._M_current)->first + 4) =
                     local_b8.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_;
                *(undefined4 *)&(iStack_90._M_current)->second =
                     local_b8.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish._0_4_;
                *(undefined4 *)((long)&(iStack_90._M_current)->second + 4) =
                     local_b8.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish._4_4_;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
            }
          }
        }
        pIVar15 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar15 != pIVar14);
    }
    local_80 = local_98;
    local_78 = iStack_90._M_current;
    if (local_98 != iStack_90._M_current) {
      ppVar11 = local_98;
      do {
        pIVar15 = ppVar11->first;
        bVar3 = MoveVariable(this,pIVar15,ppVar11->second);
        if (!bVar3) {
          SVar10 = Failure;
          goto LAB_0052f052;
        }
        uVar4 = 0;
        if (pIVar15->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
        }
        local_bc = uVar4;
        local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_68,&local_bc,&local_b8);
        ppVar11 = ppVar11 + 1;
      } while (ppVar11 != local_78);
    }
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    if (0x103ff < (pMVar1->header_).version) {
      pIVar15 = *(Instruction **)
                 ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
                 0x10);
      local_70 = (Instruction *)
                 ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8
                 );
      if (pIVar15 != local_70) {
        do {
          local_b8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pOVar7 = (pIVar15->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = (long)(pIVar15->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar7;
          cVar8 = pIVar15->has_type_id_;
          uVar12 = (uint)pIVar15->has_result_id_;
          uVar2 = (uVar12 & 1) + 1;
          if ((bool)cVar8 == false) {
            uVar2 = (uint)pIVar15->has_result_id_;
          }
          uVar13 = (int)(uVar9 >> 4) * -0x55555555 - uVar2;
          if (uVar13 != 0) {
            uVar4 = 0;
            do {
              if (uVar4 < 3) {
LAB_0052ef64:
                __x = Instruction::GetInOperand(pIVar15,uVar4);
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                push_back(&local_b8,__x);
              }
              else {
                local_bc = Instruction::GetSingleWordOperand(pIVar15,uVar2 + uVar4);
                sVar6 = std::
                        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)local_68,&local_bc);
                if (sVar6 == 0) goto LAB_0052ef64;
              }
              uVar4 = uVar4 + 1;
              pOVar7 = (pIVar15->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar9 = (long)(pIVar15->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar7;
              cVar8 = pIVar15->has_type_id_;
              uVar12 = (uint)pIVar15->has_result_id_;
              uVar2 = (uVar12 & 1) + 1;
              if ((bool)cVar8 == false) {
                uVar2 = uVar12;
              }
              uVar13 = (int)(uVar9 >> 4) * -0x55555555 - uVar2;
            } while (uVar4 < uVar13);
          }
          if (((long)local_b8.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 -
              (ulong)uVar13 != 0) {
            if (cVar8 != '\0') {
              uVar12 = (uVar12 & 1) + 1;
            }
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                      (&pIVar15->operands_,
                       (Operand *)
                       ((long)((pOVar7->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar12 * 0x30)
                       ),(Operand *)((long)((pOVar7->words).buffer + 0xfffffffffffffffa) + uVar9));
            std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                      ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                       &pIVar15->operands_,
                       (pIVar15->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       local_b8.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_b8.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            IRContext::AnalyzeUses((this->super_Pass).context_,pIVar15);
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_b8);
          pIVar15 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar15 != local_70);
      }
    }
    SVar10 = local_80 == local_78 | SuccessWithChange;
LAB_0052f052:
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_68);
    if (local_98 != (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)0x0) {
      operator_delete(local_98,(long)local_88 - (long)local_98);
    }
  }
  return SVar10;
}

Assistant:

Pass::Status PrivateToLocalPass::Process() {
  bool modified = false;

  // Private variables require the shader capability.  If this is not a shader,
  // there is no work to do.
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  std::vector<std::pair<Instruction*, Function*>> variables_to_move;
  std::unordered_set<uint32_t> localized_variables;
  for (auto& inst : context()->types_values()) {
    if (inst.opcode() != spv::Op::OpVariable) {
      continue;
    }

    if (spv::StorageClass(inst.GetSingleWordInOperand(
            kVariableStorageClassInIdx)) != spv::StorageClass::Private) {
      continue;
    }

    Function* target_function = FindLocalFunction(inst);
    if (target_function != nullptr) {
      variables_to_move.push_back({&inst, target_function});
    }
  }

  modified = !variables_to_move.empty();
  for (auto p : variables_to_move) {
    if (!MoveVariable(p.first, p.second)) {
      return Status::Failure;
    }
    localized_variables.insert(p.first->result_id());
  }

  if (get_module()->version() >= SPV_SPIRV_VERSION_WORD(1, 4)) {
    // In SPIR-V 1.4 and later entry points must list private storage class
    // variables that are statically used by the entry point. Go through the
    // entry points and remove any references to variables that were localized.
    for (auto& entry : get_module()->entry_points()) {
      std::vector<Operand> new_operands;
      for (uint32_t i = 0; i < entry.NumInOperands(); ++i) {
        // Execution model, function id and name are always kept.
        if (i < 3 ||
            !localized_variables.count(entry.GetSingleWordInOperand(i))) {
          new_operands.push_back(entry.GetInOperand(i));
        }
      }
      if (new_operands.size() != entry.NumInOperands()) {
        entry.SetInOperands(std::move(new_operands));
        context()->AnalyzeUses(&entry);
      }
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}